

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::createSchemaElementDecl
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,bool *isDuplicate,XMLCh **valConstraint
          ,bool topLevel)

{
  bool bVar1;
  int iVar2;
  XMLCh *str1;
  undefined4 extraout_var;
  SchemaElementDecl *this_00;
  uint uriId;
  uint enclosingScope;
  undefined7 in_register_00000089;
  
  if ((int)CONCAT71(in_register_00000089,topLevel) == 0) {
    uriId = this->fEmptyNamespaceURI;
    enclosingScope = this->fCurrentScope;
    str1 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_FORM,UnKnown);
    if ((((str1 == (XMLCh *)0x0) || (*str1 == L'\0')) &&
        ((this->fSchemaInfo->fElemAttrDefaultQualified & 1) != 0)) ||
       (bVar1 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgATTVAL_QUALIFIED), bVar1)) {
      uriId = this->fTargetNSURI;
    }
    iVar2 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb])
                      (this->fSchemaGrammar,(ulong)uriId,name,0,(ulong)enclosingScope);
    if ((SchemaElementDecl *)CONCAT44(extraout_var,iVar2) != (SchemaElementDecl *)0x0) {
      *isDuplicate = true;
      return (SchemaElementDecl *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    uriId = this->fTargetNSURI;
    enclosingScope = 0xfffffffe;
  }
  this_00 = (SchemaElementDecl *)XMemory::operator_new(0x80,this->fGrammarPoolMemoryManager);
  SchemaElementDecl::SchemaElementDecl
            (this_00,L"",name,uriId,Any,enclosingScope,this->fGrammarPoolMemoryManager);
  (this_00->super_XMLElementDecl).fCreateReason = Declared;
  if (topLevel) {
    this_00->fPSVIScope = SCP_GLOBAL;
  }
  processElemDeclAttrs(this,elem,this_00,valConstraint,topLevel);
  return this_00;
}

Assistant:

SchemaElementDecl*
TraverseSchema::createSchemaElementDecl(const DOMElement* const elem,
                                        const XMLCh* const name,
                                        bool& isDuplicate,
                                        const XMLCh*& valConstraint,
                                        const bool topLevel)
{
    unsigned int enclosingScope = fCurrentScope;
    int uriIndex = fEmptyNamespaceURI;

    if (topLevel) {

        uriIndex = fTargetNSURI;
        enclosingScope = Grammar::TOP_LEVEL_SCOPE;
    }
    else
    {
        const XMLCh* elemForm = getElementAttValue(elem, SchemaSymbols::fgATT_FORM);

        if (((!elemForm || !*elemForm) &&
            (fSchemaInfo->getElemAttrDefaultQualified() & Elem_Def_Qualified))
            || XMLString::equals(elemForm,SchemaSymbols::fgATTVAL_QUALIFIED))
            uriIndex = fTargetNSURI;

        // Check for duplicate elements
        SchemaElementDecl* other = (SchemaElementDecl*)
            fSchemaGrammar->getElemDecl(uriIndex, name, 0, enclosingScope);

        if (other != 0)
        {
            isDuplicate = true;
            return other;
        }
    }

    // create element decl and add it to the grammar
    Janitor<SchemaElementDecl>    elemDecl(new (fGrammarPoolMemoryManager) SchemaElementDecl(
        XMLUni::fgZeroLenString , name, uriIndex , SchemaElementDecl::Any
        , enclosingScope , fGrammarPoolMemoryManager
    ));

    elemDecl->setCreateReason(XMLElementDecl::Declared);

    if (topLevel)
        elemDecl->setPSVIScope(PSVIDefs::SCP_GLOBAL);

    // process attributes
    processElemDeclAttrs(elem, elemDecl.get(), valConstraint, topLevel);

    return elemDecl.release();
}